

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpEndpointName.cpp
# Opt level: O1

void __thiscall IpEndpointName::AddressAsString(IpEndpointName *this,char *s)

{
  ulong uVar1;
  
  uVar1 = this->address;
  if (uVar1 == 0xffffffff) {
    builtin_strncpy(s,"<any>",6);
    return;
  }
  sprintf(s,"%d.%d.%d.%d",uVar1 >> 0x18 & 0xff,(ulong)((uint)(uVar1 >> 0x10) & 0xff),
          (ulong)((uint)(uVar1 >> 8) & 0xff),(ulong)((uint)uVar1 & 0xff));
  return;
}

Assistant:

void IpEndpointName::AddressAsString( char *s ) const
{
	if( address == ANY_ADDRESS ){
		std::sprintf( s, "<any>" );
	}else{
		std::sprintf( s, "%d.%d.%d.%d",
				(int)((address >> 24) & 0xFF),
				(int)((address >> 16) & 0xFF),
				(int)((address >> 8) & 0xFF),
				(int)(address & 0xFF) );
	}
}